

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ED.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double *pdVar1;
  undefined8 uVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  int in_R8D;
  EDCircles *this;
  int i;
  ulong uVar9;
  long lVar10;
  __m128d t;
  TickMeter tm;
  allocator local_1f59;
  _InputArray local_1f58;
  Ptr<cv::ximgproc::EdgeDrawing> ed;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f30;
  double local_1f28;
  undefined8 uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> lines;
  vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> ellipses;
  int local_1ec8;
  int local_1ec4;
  int local_1ec0;
  int local_1ebc;
  int local_1eb8;
  int local_1eb4;
  int local_1eb0;
  int local_1eac;
  int local_1ea8;
  int local_1ea4;
  int local_1ea0;
  int local_1e9c;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  vector<mEllipse,_std::allocator<mEllipse>_> found_ellipses;
  vector<mCircle,_std::allocator<mCircle>_> found_circles;
  _InputArray local_1e48;
  undefined8 uStack_1e30;
  ulong local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 local_1dc0;
  undefined8 local_1db8;
  undefined8 local_1db0;
  double local_1da8;
  undefined8 local_1da0;
  undefined8 local_1d98;
  undefined8 local_1d90;
  undefined8 local_1d88;
  double local_1d80;
  int local_1d78;
  int iStack_1d74;
  undefined4 uStack_1d70;
  undefined4 uStack_1d6c;
  Mat diff;
  Mat lineImg0;
  int local_1d00;
  int local_1cfc;
  Mat ellipsImg0;
  EDCircles colorCircle;
  Mat lineImg1;
  Mat edgeImg0;
  Mat ellipsImg1;
  EDLines colorLine;
  Mat edgeImg1;
  Mat testImg;
  EDCircles testEDCircles;
  Mat colorImg;
  EDColor testEDColor;
  Mat gradImg;
  Mat anchImg;
  EDLines testEDLines;
  Mat local_cc8 [96];
  Mat local_c68 [96];
  Mat local_c08 [96];
  EDPF testEDPF;
  ED testED;
  EDColor local_730;
  EDColor local_5d8;
  ED local_480;
  ED local_258;
  
  if (argc < 2) {
    pcVar8 = "billiard.jpg";
  }
  else {
    pcVar8 = argv[1];
  }
  cv::Mat::Mat(&testImg);
  cv::Mat::Mat(&ellipsImg0);
  cv::Mat::Mat(&ellipsImg1);
  std::__cxx11::string::string((string *)&testEDCircles,pcVar8,(allocator *)&colorCircle);
  cv::imread((string *)&colorImg,(int)&testEDCircles);
  std::__cxx11::string::~string((string *)&testEDCircles);
  testEDCircles.super_EDPF.super_ED.segmentPoints.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorCircle.super_EDPF.super_ED.segmentPoints.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testEDCircles.super_EDPF.super_ED.width = 0x1010000;
  colorCircle.super_EDPF.super_ED.width = 0x2010000;
  colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&testImg;
  testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&colorImg;
  cv::cvtColor((cv *)&testEDCircles,(_InputArray *)&colorCircle,(_OutputArray *)0x6,0,in_R8D);
  cv::ximgproc::createEdgeDrawing();
  ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tm.counter = 0;
  tm.sumTime = 0;
  tm.startTime = 0;
  iVar6 = 0;
  local_1d78 = 0;
  iStack_1d74 = 0;
  uStack_1d70 = 0;
  uStack_1d6c = 0x406fe000;
  while( true ) {
    if (iVar6 == 3) break;
    std::operator<<((ostream *)&std::cout,"\n#################################################");
    poVar7 = std::operator<<((ostream *)&std::cout,"\n####### ( ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
    std::operator<<(poVar7," ) ORIGINAL & OPENCV COMPARISON ######");
    std::operator<<((ostream *)&std::cout,"\n#################################################\n");
    *(undefined8 *)((long)_ed + 0xc) = 0x2400000001;
    *(undefined4 *)((long)_ed + 0x14) = 8;
    *(undefined4 *)(_ed + 4) = 0x3f800000;
    tm.startTime = cv::getTickCount();
    cv::Mat::Mat(local_c08,&testImg);
    ED::ED(&testED,local_c08,SOBEL_OPERATOR,0x24,8,1,10,1.0,true);
    cv::Mat::~Mat(local_c08);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"testED.getEdgeImage()  (Original)  : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    testEDCircles.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testEDCircles.super_EDPF.super_ED.width = 0x1010000;
    testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&testImg;
    (**(code **)(*_ed + 0x40))(_ed,&testEDCircles);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"detectEdges()            (OpenCV)  : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    ED::getAnchorImage((ED *)&anchImg);
    ED::getGradImage((ED *)&gradImg);
    std::__cxx11::string::string((string *)&testEDCircles,"GradImage.png",(allocator *)&colorLine);
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&gradImg;
    testEDLines.super_ED.width = 0;
    testEDLines.super_ED.height = 0;
    testEDLines.super_ED.srcImg = (uchar *)0x0;
    testEDLines.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cv::imwrite((string *)&testEDCircles,(_InputArray *)&colorCircle,(vector *)&testEDLines);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&testEDLines);
    std::__cxx11::string::~string((string *)&testEDCircles);
    std::__cxx11::string::string((string *)&testEDCircles,"AnchorImage.png",(allocator *)&colorLine)
    ;
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&anchImg;
    testEDLines.super_ED.width = 0;
    testEDLines.super_ED.height = 0;
    testEDLines.super_ED.srcImg = (uchar *)0x0;
    testEDLines.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cv::imwrite((string *)&testEDCircles,(_InputArray *)&colorCircle,(vector *)&testEDLines);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&testEDLines);
    std::__cxx11::string::~string((string *)&testEDCircles);
    cv::Mat::Mat(&edgeImg1);
    cv::Mat::Mat(&diff);
    ED::getEdgeImage((ED *)&edgeImg0);
    testEDCircles.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testEDCircles.super_EDPF.super_ED.width = 0x2010000;
    testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&edgeImg1;
    (**(code **)(*_ed + 0x48))(_ed,&testEDCircles);
    testEDCircles.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testEDCircles.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&edgeImg0;
    testEDLines.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    testEDLines.super_ED.width = 0x2010000;
    testEDLines.super_ED.srcImg = (uchar *)&diff;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&edgeImg1;
    cv::absdiff((_InputArray *)&testEDCircles,(_InputArray *)&colorCircle,
                (_OutputArray *)&testEDLines);
    poVar7 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    testEDCircles.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testEDCircles.super_EDPF.super_ED.width = 0x1010000;
    testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&diff;
    iVar4 = cv::countNonZero((_InputArray *)&testEDCircles);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::string((string *)&testEDCircles,"EdgeImage.png",(allocator *)&colorLine);
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&edgeImg1;
    testEDLines.super_ED.width = 0;
    testEDLines.super_ED.height = 0;
    testEDLines.super_ED.srcImg = (uchar *)0x0;
    testEDLines.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cv::imwrite((string *)&testEDCircles,(_InputArray *)&colorCircle,(vector *)&testEDLines);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&testEDLines);
    std::__cxx11::string::~string((string *)&testEDCircles);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    ED::ED(&local_258,&testED);
    EDLines::EDLines(&testEDLines,&local_258,1.0,-1,6.0,1.3);
    ED::~ED(&local_258);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    std::operator<<((ostream *)&std::cout,"testEDLines.getLineImage()         : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    EDLines::getLineImage((EDLines *)&lineImg0);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    testEDCircles.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testEDCircles.super_EDPF.super_ED.width = -0x7dfcffe3;
    testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&lines;
    (**(code **)(*_ed + 0x60))(_ed,&testEDCircles);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"detectLines()            (OpenCV)  : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    this = &testEDCircles;
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)this,255.0);
    cv::Mat::Mat(&lineImg1,local_1d00,local_1cfc,0,(Scalar_ *)this);
    lVar10 = 0xc;
    uVar9 = 0;
    while( true ) {
      iVar4 = (int)this;
      if ((ulong)((long)lines.
                        super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)lines.
                        super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar9) break;
      colorCircle.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colorCircle.super_EDPF.super_ED.width = 0x3010000;
      colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&lineImg1;
      local_1ea0 = (int)ROUND(*(float *)(lines.
                                         super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0xc))
      ;
      local_1e9c = (int)ROUND(*(float *)(lines.
                                         super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8));
      local_1ea8 = (int)ROUND(*(float *)(lines.
                                         super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10 + -4));
      local_1ea4 = (int)ROUND(*(float *)(lines.
                                         super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10));
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&testEDCircles,0.0);
      this = (EDCircles *)0x1;
      cv::line(&colorCircle,&local_1ea0,&local_1ea8,&testEDCircles,1,0x10,0);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x10;
    }
    testEDCircles.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testEDCircles.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&lineImg0;
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&lineImg1;
    colorLine.super_ED.width = 0x2010000;
    colorLine.super_ED.srcImg = (uchar *)&diff;
    cv::absdiff((_InputArray *)&testEDCircles,(_InputArray *)&colorCircle,(_OutputArray *)&colorLine
               );
    poVar7 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    testEDCircles.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testEDCircles.super_EDPF.super_ED.width = 0x1010000;
    testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&diff;
    iVar5 = cv::countNonZero((_InputArray *)&testEDCircles);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::string((string *)&testEDCircles,"LinesImage.png",(allocator *)&testEDPF);
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&lineImg1;
    colorLine.super_ED.width = 0;
    colorLine.super_ED.height = 0;
    colorLine.super_ED.srcImg = (uchar *)0x0;
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cv::imwrite((string *)&testEDCircles,(_InputArray *)&colorCircle,(vector *)&colorLine);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&colorLine);
    std::__cxx11::string::~string((string *)&testEDCircles);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    ED::ED(&local_480,&testEDLines.super_ED);
    EDCircles::EDCircles(&testEDCircles,&local_480);
    ED::~ED(&local_480);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    std::operator<<((ostream *)&std::cout,"EDCircles(testEDLines)             : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = -0x7dfcffd2;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&ellipses;
    (**(code **)(*_ed + 0x68))(_ed,&colorCircle);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"detectEllipses()         (OpenCV)  : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    EDCircles::getCircles(&found_circles,&testEDCircles);
    EDCircles::getEllipses(&found_ellipses,&testEDCircles);
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorLine.super_ED.width = 0x2010000;
    colorLine.super_ED.srcImg = (uchar *)&ellipsImg0;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&testImg;
    cv::cvtColor((cv *)&colorCircle,(_InputArray *)&colorLine,(_OutputArray *)0x8,0,iVar4);
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorLine.super_ED.width = 0x2010000;
    colorLine.super_ED.srcImg = (uchar *)&ellipsImg1;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&testImg;
    cv::cvtColor((cv *)&colorCircle,(_InputArray *)&colorLine,(_OutputArray *)0x8,0,iVar4);
    lVar10 = 0x10;
    uVar9 = 0;
    while( true ) {
      if ((ulong)(((long)found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18) <= uVar9) break;
      iVar4 = (int)*(double *)
                    ((long)&((found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>.
                              _M_impl.super__Vector_impl_data._M_start)->center).x + lVar10);
      pdVar1 = (double *)
               ((long)found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar10 + -0x10);
      local_1f28 = (double)CONCAT44((int)pdVar1[1],(int)*pdVar1);
      uStack_1f20 = 0;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&colorCircle);
      colorCircle.super_EDPF.super_ED.height = iStack_1d74;
      colorCircle.super_EDPF.super_ED.width = local_1d78;
      colorCircle.super_EDPF.super_ED.srcImg = (uchar *)CONCAT44(uStack_1d6c,uStack_1d70);
      colorCircle.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colorCircle.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      colorLine.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colorLine.super_ED.width = 0x3010000;
      colorLine.super_ED.srcImg = (uchar *)&ellipsImg0;
      local_1d80 = local_1f28;
      local_1eb0 = iVar4;
      local_1eac = iVar4;
      cv::ellipse(0,0,0x4076800000000000,&colorLine,&local_1d80,&local_1eb0,&colorCircle,1,0x10,0);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x18;
    }
    lVar10 = 0x18;
    for (uVar9 = 0;
        uVar9 < (ulong)((long)found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1) {
      local_1f28 = (*(double *)
                     ((long)&((found_ellipses.
                               super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                               super__Vector_impl_data._M_start)->center).x + lVar10) * 180.0) /
                   3.141592653589793;
      pdVar1 = (double *)
               ((long)found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl
                      .super__Vector_impl_data._M_start + lVar10 + -0x18);
      local_1f18 = CONCAT44((int)pdVar1[1],(int)*pdVar1);
      uStack_1f10 = 0;
      uVar2 = *(undefined8 *)
               ((long)found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl
                      .super__Vector_impl_data._M_start + lVar10 + -8);
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&colorCircle);
      colorCircle.super_EDPF.super_ED.width = 0;
      colorCircle.super_EDPF.super_ED.height = 0x406fe000;
      colorCircle.super_EDPF.super_ED.srcImg = (uchar *)0x406fe00000000000;
      colorCircle.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colorCircle.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      colorLine.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colorLine.super_ED.width = 0x3010000;
      colorLine.super_ED.srcImg = (uchar *)&ellipsImg0;
      local_1d88 = local_1f18;
      local_1d90 = uVar2;
      cv::ellipse(SUB84(local_1f28,0),0,0x4076800000000000,&colorLine,&local_1d88,&local_1d90,
                  &colorCircle,1,0x10,0);
      lVar10 = lVar10 + 0x20;
    }
    lVar10 = 0x28;
    uVar9 = 0;
    while( true ) {
      if ((ulong)(((long)ellipses.
                         super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)ellipses.
                        super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar9) break;
      iVar4 = (int)*(double *)
                    (ellipses.
                     super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar10 + -0x18);
      local_1f28 = *(double *)
                    (ellipses.
                     super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar10);
      local_1f18 = CONCAT44((int)*(double *)
                                  (ellipses.
                                   super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x28 + 8),
                            (int)*(double *)
                                  (ellipses.
                                   super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x28));
      uStack_1f10 = 0;
      local_1de8 = -(ulong)(*(double *)
                             (ellipses.
                              super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x18) == 0.0) &
                   0x406fe00000000000;
      uStack_1de0 = 0;
      local_1dd8 = CONCAT44(iVar4 + (int)*(double *)
                                          (ellipses.
                                           super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                           lVar10 + -0x10 + 8),
                            iVar4 + (int)*(double *)
                                          (ellipses.
                                           super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                          lVar10 + -0x10));
      uStack_1dd0 = 0;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&colorCircle);
      colorCircle.super_EDPF.super_ED.width = (undefined4)local_1de8;
      colorCircle.super_EDPF.super_ED.height = local_1de8._4_4_;
      colorCircle.super_EDPF.super_ED.srcImg = (uchar *)0x406fe00000000000;
      colorCircle.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colorCircle.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      colorLine.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colorLine.super_ED.width = 0x3010000;
      colorLine.super_ED.srcImg = (uchar *)&ellipsImg1;
      local_1d98 = local_1f18;
      local_1da0 = local_1dd8;
      cv::ellipse(SUB84(local_1f28,0),0,0x4076800000000000,&colorLine,&local_1d98,&local_1da0,
                  &colorCircle,1,0x10,0);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x30;
    }
    std::__cxx11::string::string
              ((string *)&colorCircle,"EllipsImage-Original.png",(allocator *)&testEDColor);
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorLine.super_ED.width = 0x1010000;
    colorLine.super_ED.srcImg = (uchar *)&ellipsImg0;
    testEDPF.super_ED.width = 0;
    testEDPF.super_ED.height = 0;
    testEDPF.super_ED.srcImg = (uchar *)0x0;
    testEDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cv::imwrite((string *)&colorCircle,(_InputArray *)&colorLine,(vector *)&testEDPF);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&testEDPF);
    std::__cxx11::string::~string((string *)&colorCircle);
    std::__cxx11::string::string
              ((string *)&colorCircle,"EllipsImage-OpenCV.png",(allocator *)&testEDColor);
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorLine.super_ED.width = 0x1010000;
    colorLine.super_ED.srcImg = (uchar *)&ellipsImg1;
    testEDPF.super_ED.width = 0;
    testEDPF.super_ED.height = 0;
    testEDPF.super_ED.srcImg = (uchar *)0x0;
    testEDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cv::imwrite((string *)&colorCircle,(_InputArray *)&colorLine,(vector *)&testEDPF);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&testEDPF);
    std::__cxx11::string::~string((string *)&colorCircle);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    cv::Mat::Mat(local_c68,&testImg);
    EDPF::EDPF(&testEDPF,local_c68);
    cv::Mat::~Mat(local_c68);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"testEDPF.getEdgeImage()            : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    *(undefined8 *)((long)_ed + 0xc) = 0xb00000000;
    *(undefined4 *)((long)_ed + 0x14) = 3;
    *(undefined1 *)(_ed + 1) = 1;
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&testImg;
    (**(code **)(*_ed + 0x40))(_ed,&colorCircle);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"detectEdges()  PF        (OpenCV)  : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    ED::getEdgeImage((ED *)&colorCircle);
    cv::Mat::operator=(&edgeImg0,(Mat *)&colorCircle);
    cv::Mat::~Mat((Mat *)&colorCircle);
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x2010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&edgeImg1;
    (**(code **)(*_ed + 0x48))(_ed,&colorCircle);
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&edgeImg0;
    testEDColor._16_8_ = 0;
    colorLine.super_ED.width = 0x1010000;
    testEDColor._0_4_ = 0x2010000;
    testEDColor._8_8_ = &diff;
    colorLine.super_ED.srcImg = (uchar *)&edgeImg1;
    cv::absdiff((_InputArray *)&colorCircle,(_InputArray *)&colorLine,(_OutputArray *)&testEDColor);
    poVar7 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&diff;
    iVar4 = cv::countNonZero((_InputArray *)&colorCircle);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::string((string *)&colorCircle,"EdgeImage-PF.png",(allocator *)&local_1e48)
    ;
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorLine.super_ED.width = 0x1010000;
    colorLine.super_ED.srcImg = (uchar *)&edgeImg1;
    testEDColor.inputImage = (Mat)0x0;
    testEDColor._1_7_ = 0;
    testEDColor._8_8_ = 0;
    testEDColor._16_8_ = 0;
    cv::imwrite((string *)&colorCircle,(_InputArray *)&colorLine,(vector *)&testEDColor);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&testEDColor);
    std::__cxx11::string::~string((string *)&colorCircle);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    cv::Mat::Mat(local_cc8,&colorImg);
    EDColor::EDColor(&testEDColor,local_cc8,0x24,4,1.5,false);
    cv::Mat::~Mat(local_cc8);
    EDColor::getEdgeImage((EDColor *)&colorCircle);
    cv::Mat::operator=(&edgeImg0,(Mat *)&colorCircle);
    cv::Mat::~Mat((Mat *)&colorCircle);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    std::operator<<((ostream *)&std::cout,"testEDColor.getEdgeImage()         : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    *(undefined8 *)((long)_ed + 0xc) = 0x2400000000;
    *(undefined4 *)((long)_ed + 0x14) = 4;
    *(undefined4 *)(_ed + 4) = 0x3fc00000;
    *(undefined1 *)(_ed + 1) = 0;
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&colorImg;
    (**(code **)(*_ed + 0x40))(_ed,&colorCircle);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"detectEdges()            (OpenCV)  : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x2010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&edgeImg1;
    (**(code **)(*_ed + 0x48))(_ed,&colorCircle);
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&edgeImg0;
    local_1e48.sz.width = 0;
    local_1e48.sz.height = 0;
    colorLine.super_ED.width = 0x1010000;
    local_1e48.flags = 0x2010000;
    local_1e48.obj = &diff;
    colorLine.super_ED.srcImg = (uchar *)&edgeImg1;
    cv::absdiff((_InputArray *)&colorCircle,(_InputArray *)&colorLine,(_OutputArray *)&local_1e48);
    poVar7 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&diff;
    iVar4 = cv::countNonZero((_InputArray *)&colorCircle);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::string
              ((string *)&colorCircle,"EdgeImage-Color.png",(allocator *)&local_1f58);
    colorLine.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorLine.super_ED.width = 0x1010000;
    colorLine.super_ED.srcImg = (uchar *)&edgeImg0;
    local_1e48.flags = 0;
    local_1e48._4_4_ = 0;
    local_1e48.obj = (void *)0x0;
    local_1e48.sz.width = 0;
    local_1e48.sz.height = 0;
    cv::imwrite((string *)&colorCircle,(_InputArray *)&colorLine,(vector *)&local_1e48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_1e48);
    std::__cxx11::string::~string((string *)&colorCircle);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    EDColor::EDColor(&local_5d8,&testEDColor);
    EDLines::EDLines(&colorLine,&local_5d8,1.0,-1,6.0,1.3);
    EDColor::~EDColor(&local_5d8);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    std::operator<<((ostream *)&std::cout,"get lines from color image         : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    EDLines::getLineImage((EDLines *)&colorCircle);
    cv::Mat::operator=(&lineImg0,(Mat *)&colorCircle);
    cv::Mat::~Mat((Mat *)&colorCircle);
    std::__cxx11::string::string
              ((string *)&colorCircle,"LinesImage-Color.png",(allocator *)&local_1e98);
    local_1e48.sz.width = 0;
    local_1e48.sz.height = 0;
    local_1e48.flags = 0x1010000;
    local_1e48.obj = &lineImg0;
    local_1f58.flags = 0;
    local_1f58._4_4_ = 0;
    local_1f58.obj = (void *)0x0;
    local_1f58.sz.width = 0;
    local_1f58.sz.height = 0;
    cv::imwrite((string *)&colorCircle,&local_1e48,(vector *)&local_1f58);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_1f58);
    std::__cxx11::string::~string((string *)&colorCircle);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = -0x7dfcffe3;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&lines;
    (**(code **)(*_ed + 0x60))(_ed,&colorCircle);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"detectLines()            (OpenCV)  : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&local_1e48,255.0);
    cv::Mat::Mat((Mat *)&colorCircle,local_1d00,local_1cfc,0,(Scalar_ *)&local_1e48);
    cv::Mat::operator=(&lineImg1,(Mat *)&colorCircle);
    cv::Mat::~Mat((Mat *)&colorCircle);
    lVar10 = 0xc;
    for (uVar9 = 0;
        uVar9 < (ulong)((long)lines.
                              super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)lines.
                              super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar9 = uVar9 + 1) {
      local_1e48.sz.width = 0;
      local_1e48.sz.height = 0;
      local_1e48.flags = 0x3010000;
      local_1e48.obj = &lineImg1;
      local_1eb8 = (int)ROUND(*(float *)(lines.
                                         super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0xc))
      ;
      local_1eb4 = (int)ROUND(*(float *)(lines.
                                         super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8));
      local_1ec0 = (int)ROUND(*(float *)(lines.
                                         super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10 + -4));
      local_1ebc = (int)ROUND(*(float *)(lines.
                                         super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10));
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&colorCircle,0.0);
      cv::line(&local_1e48,&local_1eb8,&local_1ec0,&colorCircle,1,0x10,0);
      lVar10 = lVar10 + 0x10;
    }
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    local_1e48.sz.width = 0;
    local_1e48.sz.height = 0;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&lineImg0;
    local_1f58.sz.width = 0;
    local_1f58.sz.height = 0;
    local_1e48.flags = 0x1010000;
    local_1e48.obj = &lineImg1;
    local_1f58.flags = 0x2010000;
    local_1f58.obj = &diff;
    cv::absdiff((_InputArray *)&colorCircle,&local_1e48,(_OutputArray *)&local_1f58);
    poVar7 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    colorCircle.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorCircle.super_EDPF.super_ED.width = 0x1010000;
    colorCircle.super_EDPF.super_ED.srcImg = (uchar *)&diff;
    iVar4 = cv::countNonZero((_InputArray *)&colorCircle);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    EDColor::EDColor(&local_730,&testEDColor);
    EDCircles::EDCircles(&colorCircle,&local_730);
    EDColor::~EDColor(&local_730);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"get circles from color image       : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    tm.counter = 0;
    tm.sumTime = 0;
    tm.startTime = 0;
    tm.startTime = cv::getTickCount();
    local_1e48.sz.width = 0;
    local_1e48.sz.height = 0;
    local_1e48.flags = 0x8203002e;
    local_1e48.obj = &ellipses;
    (**(code **)(*_ed + 0x68))(_ed,&local_1e48);
    cv::TickMeter::stop(&tm);
    std::operator<<((ostream *)&std::cout,"detectEllipses()         (OpenCV)  : ");
    dVar3 = cv::TickMeter::getTimeMilli(&tm);
    poVar7 = std::ostream::_M_insert<double>(dVar3);
    poVar7 = std::operator<<(poVar7," ms.");
    std::endl<char,std::char_traits<char>>(poVar7);
    EDCircles::getCircles((vector<mCircle,_std::allocator<mCircle>_> *)&local_1e48,&colorCircle);
    std::vector<mCircle,_std::allocator<mCircle>_>::_M_move_assign(&found_circles,&local_1e48);
    std::_Vector_base<mCircle,_std::allocator<mCircle>_>::~_Vector_base
              ((_Vector_base<mCircle,_std::allocator<mCircle>_> *)&local_1e48);
    EDCircles::getEllipses((vector<mEllipse,_std::allocator<mEllipse>_> *)&local_1e48,&colorCircle);
    std::vector<mEllipse,_std::allocator<mEllipse>_>::_M_move_assign(&found_ellipses,&local_1e48);
    std::_Vector_base<mEllipse,_std::allocator<mEllipse>_>::~_Vector_base
              ((_Vector_base<mEllipse,_std::allocator<mEllipse>_> *)&local_1e48);
    cv::Mat::clone();
    cv::Mat::operator=(&ellipsImg0,(Mat *)&local_1e48);
    cv::Mat::~Mat((Mat *)&local_1e48);
    cv::Mat::clone();
    cv::Mat::operator=(&ellipsImg1,(Mat *)&local_1e48);
    cv::Mat::~Mat((Mat *)&local_1e48);
    lVar10 = 0x10;
    uVar9 = 0;
    while( true ) {
      if ((ulong)(((long)found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18) <= uVar9) break;
      iVar4 = (int)*(double *)
                    ((long)&((found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>.
                              _M_impl.super__Vector_impl_data._M_start)->center).x + lVar10);
      pdVar1 = (double *)
               ((long)found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar10 + -0x10);
      local_1f28 = (double)CONCAT44((int)pdVar1[1],(int)*pdVar1);
      uStack_1f20 = 0;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_1e48);
      local_1e48._0_8_ = CONCAT44(iStack_1d74,local_1d78);
      local_1e48.obj = (void *)CONCAT44(uStack_1d6c,uStack_1d70);
      local_1e48.sz.width = 0;
      local_1e48.sz.height = 0;
      uStack_1e30 = 0;
      local_1f58.sz.width = 0;
      local_1f58.sz.height = 0;
      local_1f58.flags = 0x3010000;
      local_1f58.obj = &ellipsImg0;
      local_1da8 = local_1f28;
      local_1ec8 = iVar4;
      local_1ec4 = iVar4;
      cv::ellipse(0,0,0x4076800000000000,&local_1f58,&local_1da8,&local_1ec8,&local_1e48,2,0x10,0);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x18;
    }
    lVar10 = 0x18;
    for (uVar9 = 0;
        uVar9 < (ulong)((long)found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1) {
      local_1f28 = (*(double *)
                     ((long)&((found_ellipses.
                               super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                               super__Vector_impl_data._M_start)->center).x + lVar10) * 180.0) /
                   3.141592653589793;
      pdVar1 = (double *)
               ((long)found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl
                      .super__Vector_impl_data._M_start + lVar10 + -0x18);
      local_1f18 = CONCAT44((int)pdVar1[1],(int)*pdVar1);
      uStack_1f10 = 0;
      uVar2 = *(undefined8 *)
               ((long)found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl
                      .super__Vector_impl_data._M_start + lVar10 + -8);
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_1e48);
      local_1e48._0_8_ = 0x406fe00000000000;
      local_1e48.obj =
           (vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)0x406fe00000000000;
      local_1e48.sz.width = 0;
      local_1e48.sz.height = 0;
      uStack_1e30 = 0;
      local_1f58.sz.width = 0;
      local_1f58.sz.height = 0;
      local_1f58.flags = 0x3010000;
      local_1f58.obj = &ellipsImg0;
      local_1db0 = local_1f18;
      local_1db8 = uVar2;
      cv::ellipse(SUB84(local_1f28,0),0,0x4076800000000000,&local_1f58,&local_1db0,&local_1db8,
                  &local_1e48,2,0x10,0);
      lVar10 = lVar10 + 0x20;
    }
    lVar10 = 0x28;
    uVar9 = 0;
    while( true ) {
      if ((ulong)(((long)ellipses.
                         super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)ellipses.
                        super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar9) break;
      iVar4 = (int)*(double *)
                    (ellipses.
                     super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar10 + -0x18);
      local_1f28 = *(double *)
                    (ellipses.
                     super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar10);
      local_1f18 = CONCAT44((int)*(double *)
                                  (ellipses.
                                   super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x28 + 8),
                            (int)*(double *)
                                  (ellipses.
                                   super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x28));
      uStack_1f10 = 0;
      local_1de8 = -(ulong)(*(double *)
                             (ellipses.
                              super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x18) == 0.0) &
                   0x406fe00000000000;
      uStack_1de0 = 0;
      local_1dd8 = CONCAT44(iVar4 + (int)*(double *)
                                          (ellipses.
                                           super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                           lVar10 + -0x10 + 8),
                            iVar4 + (int)*(double *)
                                          (ellipses.
                                           super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                          lVar10 + -0x10));
      uStack_1dd0 = 0;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_1e48);
      local_1e48._0_8_ = local_1de8;
      local_1e48.obj =
           (vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)0x406fe00000000000;
      local_1e48.sz.width = 0;
      local_1e48.sz.height = 0;
      uStack_1e30 = 0;
      local_1f58.sz.width = 0;
      local_1f58.sz.height = 0;
      local_1f58.flags = 0x3010000;
      local_1f58.obj = &ellipsImg1;
      local_1dc0 = local_1f18;
      local_1dc8 = local_1dd8;
      cv::ellipse(SUB84(local_1f28,0),0,0x4076800000000000,&local_1f58,&local_1dc0,&local_1dc8,
                  &local_1e48,2,0x10,0);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x30;
    }
    std::__cxx11::string::string((string *)&local_1e48,"EllipsImageColor-Original.png",&local_1f59);
    local_1f58.sz.width = 0;
    local_1f58.sz.height = 0;
    local_1f58.flags = 0x1010000;
    local_1f58.obj = &ellipsImg0;
    local_1e98 = 0;
    uStack_1e90 = 0;
    local_1e88 = 0;
    cv::imwrite((string *)&local_1e48,&local_1f58,(vector *)&local_1e98);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_1e98);
    std::__cxx11::string::~string((string *)&local_1e48);
    std::__cxx11::string::string((string *)&local_1e48,"EllipsImageColor-OpenCV.png",&local_1f59);
    local_1f58.sz.width = 0;
    local_1f58.sz.height = 0;
    local_1f58.flags = 0x1010000;
    local_1f58.obj = &ellipsImg1;
    local_1e98 = 0;
    uStack_1e90 = 0;
    local_1e88 = 0;
    cv::imwrite((string *)&local_1e48,&local_1f58,(vector *)&local_1e98);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_1e98);
    std::__cxx11::string::~string((string *)&local_1e48);
    EDCircles::~EDCircles(&colorCircle);
    EDLines::~EDLines(&colorLine);
    EDColor::~EDColor(&testEDColor);
    ED::~ED(&testEDPF.super_ED);
    std::_Vector_base<mEllipse,_std::allocator<mEllipse>_>::~_Vector_base
              (&found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>);
    std::_Vector_base<mCircle,_std::allocator<mCircle>_>::~_Vector_base
              (&found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>);
    EDCircles::~EDCircles(&testEDCircles);
    cv::Mat::~Mat(&lineImg1);
    cv::Mat::~Mat(&lineImg0);
    EDLines::~EDLines(&testEDLines);
    cv::Mat::~Mat(&edgeImg0);
    cv::Mat::~Mat(&diff);
    cv::Mat::~Mat(&edgeImg1);
    cv::Mat::~Mat(&gradImg);
    cv::Mat::~Mat(&anchImg);
    ED::~ED(&testED);
    iVar6 = iVar6 + 1;
  }
  std::_Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::~_Vector_base
            (&lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>);
  std::_Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::~_Vector_base
            (&ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f30);
  cv::Mat::~Mat(&colorImg);
  cv::Mat::~Mat(&ellipsImg1);
  cv::Mat::~Mat(&ellipsImg0);
  cv::Mat::~Mat(&testImg);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    char* filename;
    if (argc > 1)
        filename = argv[1];
    else
        filename = "billiard.jpg";

    Mat testImg, ellipsImg0, ellipsImg1;
    Mat colorImg = imread(filename);
    cvtColor(colorImg, testImg, COLOR_BGR2GRAY);

    Ptr<EdgeDrawing> ed = createEdgeDrawing();
    vector<Vec6d> ellipses;
    vector<Vec4f> lines;

    TickMeter tm;
    for (int i = 0; i < 3; i++)
    {
        cout << "\n#################################################";
        cout << "\n####### ( " << i << " ) ORIGINAL & OPENCV COMPARISON ######";
        cout << "\n#################################################\n";

        ed->params.EdgeDetectionOperator = EdgeDrawing::SOBEL;
        ed->params.GradientThresholdValue = 36;
        ed->params.AnchorThresholdValue = 8;
        ed->params.Sigma = 1.0;

        //Detection of edge segments from an input image    
        tm.start();
        //Call ED constructor
        ED testED = ED(testImg, SOBEL_OPERATOR, 36, 8, 1, 10, 1.0, true);
        tm.stop();
        std::cout << "testED.getEdgeImage()  (Original)  : " << tm.getTimeMilli() << " ms." << endl;

        tm.reset();
        tm.start();
        ed->detectEdges(testImg);
        tm.stop();
        std::cout << "detectEdges()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        Mat anchImg = testED.getAnchorImage();
        Mat gradImg = testED.getGradImage();
        imwrite("GradImage.png", gradImg);
        imwrite("AnchorImage.png", anchImg);

        Mat edgeImg1, diff;
        Mat edgeImg0 = testED.getEdgeImage();
        ed->getEdgeImage(edgeImg1);
        absdiff(edgeImg0, edgeImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;

        imwrite("EdgeImage.png", edgeImg1);

        //***************************** EDLINES Line Segment Detection *****************************
        //Detection of lines segments from edge segments instead of input image
        //Therefore, redundant detection of edge segmens can be avoided
        tm.reset();
        tm.start();
        EDLines testEDLines = EDLines(testED);
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "testEDLines.getLineImage()         : " << tm.getTimeMilli() << " ms." << endl;
        Mat lineImg0 = testEDLines.getLineImage();    //draws on an empty image

        tm.reset();
        tm.start();
        ed->detectLines(lines);
        tm.stop();
        cout << "detectLines()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        Mat lineImg1 = Mat(lineImg0.rows, lineImg0.cols, CV_8UC1, Scalar(255));

        for (int i = 0; i < lines.size(); i++)
            line(lineImg1, Point2d(lines[i][0], lines[i][1]), Point2d(lines[i][2], lines[i][3]), Scalar(0), 1, LINE_AA);

        absdiff(lineImg0, lineImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        imwrite("LinesImage.png", lineImg1);

        //***************************** EDCIRCLES Circle Segment Detection *****************************
        //Detection of circles from already available EDPF or ED image
        tm.reset();
        tm.start();
        EDCircles testEDCircles = EDCircles(testEDLines);
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "EDCircles(testEDLines)             : " << tm.getTimeMilli() << " ms." << endl;

        tm.reset();
        tm.start();
        ed->detectEllipses(ellipses);
        tm.stop();
        cout << "detectEllipses()         (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;
        cout << "-------------------------------------------------\n";

        vector<mCircle> found_circles = testEDCircles.getCircles();
        vector<mEllipse> found_ellipses = testEDCircles.getEllipses();

        cvtColor(testImg, ellipsImg0, COLOR_GRAY2BGR);
        cvtColor(testImg, ellipsImg1, COLOR_GRAY2BGR);
 
        for (int i = 0; i < found_circles.size(); i++)
        {
            Point center((int)found_circles[i].center.x, (int)found_circles[i].center.y);
            Size axes((int)found_circles[i].r, (int)found_circles[i].r);
            double angle(0.0);
            Scalar color = Scalar(0, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 1, LINE_AA);
        }

        for (int i = 0; i < found_ellipses.size(); i++)
        {
            Point center((int)found_ellipses[i].center.x, (int)found_ellipses[i].center.y);
            Size axes((int)found_ellipses[i].axes.width, (int)found_ellipses[i].axes.height);
            double angle = found_ellipses[i].theta * 180 / CV_PI;
            Scalar color = Scalar(255, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 1, LINE_AA);
        }

        for (size_t i = 0; i < ellipses.size(); i++)
        {
            Point center((int)ellipses[i][0], (int)ellipses[i][1]);
            Size axes((int)ellipses[i][2] + (int)ellipses[i][3], (int)ellipses[i][2] + (int)ellipses[i][4]);
            double angle(ellipses[i][5]);
            Scalar color = ellipses[i][2] == 0 ? Scalar(255, 255, 0) : Scalar(0, 255, 0);

            ellipse(ellipsImg1, center, axes, angle, 0, 360, color, 1, LINE_AA);
        }

        imwrite("EllipsImage-Original.png", ellipsImg0);
        imwrite("EllipsImage-OpenCV.png", ellipsImg1);

        //************************** EDPF Parameter-free Edge Segment Detection **************************
        // Detection of edge segments with parameter free ED (EDPF)
        tm.reset();
        tm.start();
        EDPF testEDPF = EDPF(testImg);
        tm.stop();
        cout << "testEDPF.getEdgeImage()            : " << tm.getTimeMilli() << " ms." << endl;

        ed->params.EdgeDetectionOperator = EdgeDrawing::PREWITT;
        ed->params.GradientThresholdValue = 11;
        ed->params.AnchorThresholdValue = 3;
        ed->params.PFmode = true;

        tm.reset();
        tm.start();
        ed->detectEdges(testImg);
        tm.stop();
        std::cout << "detectEdges()  PF        (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        edgeImg0 = testEDPF.getEdgeImage();
        ed->getEdgeImage(edgeImg1);
        absdiff(edgeImg0, edgeImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        imwrite("EdgeImage-PF.png", edgeImg1);

        //*********************** EDCOLOR Edge Segment Detection from Color Images **********************

        tm.reset();
        tm.start();
        EDColor testEDColor = EDColor(colorImg, 36);
        edgeImg0 = testEDColor.getEdgeImage();
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "testEDColor.getEdgeImage()         : " << tm.getTimeMilli() << " ms." << endl;

        ed->params.EdgeDetectionOperator = EdgeDrawing::PREWITT;
        ed->params.GradientThresholdValue = 36;
        ed->params.AnchorThresholdValue = 4;
        ed->params.Sigma = 1.5;
        ed->params.PFmode = false;
        tm.reset();
        tm.start();
        ed->detectEdges(colorImg);
        tm.stop();
        cout << "detectEdges()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        ed->getEdgeImage(edgeImg1);
        absdiff(edgeImg0, edgeImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        imwrite("EdgeImage-Color.png", edgeImg0);

        tm.reset();
        tm.start();
        // get lines from color image
        EDLines colorLine = EDLines(testEDColor);
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "get lines from color image         : " << tm.getTimeMilli() << " ms." << endl;
        lineImg0 = colorLine.getLineImage();
        imwrite("LinesImage-Color.png", lineImg0);
        tm.reset();
        tm.start();
        ed->detectLines(lines);
        tm.stop();
        cout << "detectLines()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        lineImg1 = Mat(lineImg0.rows, lineImg0.cols, CV_8UC1, Scalar(255));

        for (int i = 0; i < lines.size(); i++)
            line(lineImg1, Point2d(lines[i][0], lines[i][1]), Point2d(lines[i][2], lines[i][3]), Scalar(0), 1, LINE_AA);

        absdiff(lineImg0, lineImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        cout << "-------------------------------------------------\n";
        tm.reset();
        tm.start();
        // get circles from color image
        EDCircles colorCircle = EDCircles(testEDColor);
        tm.stop();
        cout << "get circles from color image       : " << tm.getTimeMilli() << " ms." << endl;
        tm.reset();
        tm.start();
        ed->detectEllipses(ellipses);
        tm.stop();
        cout << "detectEllipses()         (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        found_circles = colorCircle.getCircles();
        found_ellipses = colorCircle.getEllipses();

        ellipsImg0 = colorImg.clone();
        ellipsImg1 = colorImg.clone();
        for (int i = 0; i < found_circles.size(); i++)
        {
            Point center((int)found_circles[i].center.x, (int)found_circles[i].center.y);
            Size axes((int)found_circles[i].r, (int)found_circles[i].r);
            double angle(0.0);
            Scalar color = Scalar(0, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 2, LINE_AA);
        }

        for (int i = 0; i < found_ellipses.size(); i++)
        {
            Point center((int)found_ellipses[i].center.x, (int)found_ellipses[i].center.y);
            Size axes((int)found_ellipses[i].axes.width, (int)found_ellipses[i].axes.height);
            double angle = found_ellipses[i].theta * 180 / CV_PI;
            Scalar color = Scalar(255, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 2, LINE_AA);
        }

        for (size_t i = 0; i < ellipses.size(); i++)
        {
            Point center((int)ellipses[i][0], (int)ellipses[i][1]);
            Size axes((int)ellipses[i][2] + (int)ellipses[i][3], (int)ellipses[i][2] + (int)ellipses[i][4]);
            double angle(ellipses[i][5]);
            Scalar color = ellipses[i][2] == 0 ? Scalar(255, 255, 0) : Scalar(0, 255, 0);

            ellipse(ellipsImg1, center, axes, angle, 0, 360, color, 2, LINE_AA);
        }

        imwrite("EllipsImageColor-Original.png", ellipsImg0);
        imwrite("EllipsImageColor-OpenCV.png", ellipsImg1);
    }
    return 0;
}